

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdIsFindPsbtPubkeyRecord(void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey)

{
  pointer *ppuVar1;
  pointer puVar2;
  bool bVar3;
  CfdException *pCVar4;
  KeyData pk_obj;
  Pubkey local_248;
  ByteData local_228;
  int local_20c;
  undefined1 local_208 [40];
  pointer local_1e0;
  pointer local_1c8;
  pointer local_1b0;
  ByteData local_198;
  KeyData local_180;
  
  local_20c = kind;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10
            );
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_180);
  if ((pointer *)
      local_180.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pubkey == (char *)0x0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x642;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"pubkey is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to parameter. pubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_180);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x648;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_180);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ParsePubkey(&local_180,kind,pubkey,*(NetType *)((long)psbt_handle + 0x10));
  cfd::core::ByteData::ByteData(&local_228);
  switch(kind) {
  case 1:
    cfd::core::KeyData::GetPubkey(&local_248,&local_180);
    cfd::core::Psbt::CreatePubkeyRecordKey((ByteData *)local_208,'\x02',&local_248);
    break;
  case 2:
    cfd::core::KeyData::GetPubkey(&local_248,&local_180);
    cfd::core::Psbt::CreatePubkeyRecordKey((ByteData *)local_208,'\x06',&local_248);
    break;
  case 3:
    cfd::core::KeyData::GetPubkey(&local_248,&local_180);
    cfd::core::Psbt::CreatePubkeyRecordKey((ByteData *)local_208,'\x02',&local_248);
    puVar2 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_208._8_8_;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_208._16_8_;
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    if ((puVar2 != (pointer)0x0) &&
       (operator_delete(puVar2), (pointer)local_208._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_208._0_8_);
    }
    if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    bVar3 = cfd::core::Psbt::IsFindTxOutRecord
                      (*(Psbt **)((long)psbt_handle + 0x18),index,&local_228);
    goto LAB_00419c3a;
  case 4:
    cfd::core::KeyData::GetExtPubkey((ExtPubkey *)local_208,&local_180);
    cfd::core::ExtPubkey::GetData(&local_198,(ExtPubkey *)local_208);
    cfd::core::Psbt::CreateFixRecordKey(&local_248.data_,'\x01',&local_198);
    puVar2 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((puVar2 != (pointer)0x0) &&
       (operator_delete(puVar2),
       local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_248.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1b0 != (pointer)0x0) {
      operator_delete(local_1b0);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if (local_1e0 != (pointer)0x0) {
      operator_delete(local_1e0);
    }
    if ((pointer)local_208._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_208._0_8_);
    }
    bVar3 = cfd::core::Psbt::IsFindGlobalRecord(*(Psbt **)((long)psbt_handle + 0x18),&local_228);
    goto LAB_00419c3a;
  default:
    local_208._0_8_ = "cfdcapi_psbt.cpp";
    local_208._8_4_ = 0x667;
    local_208._16_8_ = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::log<int&>
              ((CfdSourceLocation *)local_208,kCfdLogLevelWarning,"kind is invalid: {}",&local_20c);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"Failed to parameter. kind is invalid.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_208);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  puVar2 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
  local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_208._8_8_;
  local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_208._16_8_;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_208._16_8_ = (pointer)0x0;
  if ((puVar2 != (pointer)0x0) &&
     (operator_delete(puVar2), (pointer)local_208._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar3 = cfd::core::Psbt::IsFindTxInRecord(*(Psbt **)((long)psbt_handle + 0x18),index,&local_228);
LAB_00419c3a:
  if (local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::KeyData::~KeyData(&local_180);
  return (uint)(bVar3 ^ 1) << 3;
}

Assistant:

int CfdIsFindPsbtPubkeyRecord(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);
    ByteData key;
    bool is_find = true;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputPartialSig, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key);
        break;
      case kCfdPsbtRecordInputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputBip32Derivation, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key);
        break;
      case kCfdPsbtRecordOutputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtOutputBip32Derivation, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxOutRecord(index, key);
        break;
      case kCfdPsbtRecordGloalXpub:
        key = Psbt::CreateFixRecordKey(
            Psbt::kPsbtGlobalXpub, pk_obj.GetExtPubkey().GetData());
        is_find = psbt_obj->psbt->IsFindGlobalRecord(key);
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    if (!is_find) return CfdErrorCode::kCfdNotFoundError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}